

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

bool __thiscall
ON_DimStyle::Internal_SetStringMember
          (ON_DimStyle *this,field field_id,wchar_t *value,ON_wString *class_member)

{
  bool bVar1;
  bool bValueChanged;
  ON_wString *class_member_local;
  wchar_t *value_local;
  field field_id_local;
  ON_DimStyle *this_local;
  
  bVar1 = ON_wString::IsValid(class_member,true);
  class_member_local = (ON_wString *)value;
  if (!bVar1) {
    class_member_local = (ON_wString *)anon_var_dwarf_569f;
  }
  bVar1 = ON_wString::EqualOrdinal(class_member,(wchar_t *)class_member_local,false);
  if (!bVar1) {
    ON_wString::operator=(class_member,(wchar_t *)class_member_local);
    Internal_ContentChange(this);
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,field_id);
  return !bVar1;
}

Assistant:

bool ON_DimStyle::Internal_SetStringMember(
  ON_DimStyle::field field_id,
  const wchar_t* value,
  ON_wString& class_member
)
{
  if (false == class_member.IsValid(true))
  {
    // just in case value pointed to the bogus string array.
    value = L"";
  }
  bool bValueChanged = false;
  if (false == class_member.EqualOrdinal(value,false) )
  {
    class_member = value;
    Internal_ContentChange();
    bValueChanged = true;
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(field_id);
  return bValueChanged;
}